

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestSessionExecutor.cpp
# Opt level: O1

void __thiscall
tcu::TestSessionExecutor::enterTestPackage(TestSessionExecutor *this,TestPackage *testPackage)

{
  TestCaseExecutor *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = (*(testPackage->super_TestNode)._vptr_TestNode[5])(testPackage);
  pTVar1 = (this->m_caseExecutor).
           super_UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>.
           m_data.ptr;
  if (pTVar1 != (TestCaseExecutor *)CONCAT44(extraout_var,iVar2)) {
    if (pTVar1 != (TestCaseExecutor *)0x0) {
      (*pTVar1->_vptr_TestCaseExecutor[1])();
      (this->m_caseExecutor).
      super_UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>.m_data.ptr
           = (TestCaseExecutor *)0x0;
    }
    (this->m_caseExecutor).
    super_UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>.m_data.ptr =
         (TestCaseExecutor *)CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

void TestSessionExecutor::enterTestPackage (TestPackage* testPackage)
{
	// Create test case wrapper
	DE_ASSERT(!m_caseExecutor);
	m_caseExecutor = de::MovePtr<TestCaseExecutor>(testPackage->createExecutor());
}